

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

void jsonnet_json_object_append(JsonnetVm *vm,JsonnetJsonValue *obj,char *f,JsonnetJsonValue *v)

{
  JsonnetJsonValue *__ptr;
  _Head_base<0UL,_JsonnetJsonValue_*,_false> _Var1;
  default_delete<JsonnetJsonValue> *this;
  allocator<char> local_31;
  _Head_base<0UL,_JsonnetJsonValue_*,_false> local_30;
  key_type local_28;
  
  if (obj->kind == OBJECT) {
    local_30._M_head_impl = v;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,f,&local_31);
    this = (default_delete<JsonnetJsonValue> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
           ::operator[](&obj->fields,&local_28);
    _Var1._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (JsonnetJsonValue *)0x0;
    __ptr = *(JsonnetJsonValue **)this;
    *(JsonnetJsonValue **)this = _Var1._M_head_impl;
    if (__ptr != (JsonnetJsonValue *)0x0) {
      std::default_delete<JsonnetJsonValue>::operator()(this,__ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::~unique_ptr
              ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)&local_30);
    return;
  }
  __assert_fail("obj->kind == JsonnetJsonValue::OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/libjsonnet.cpp"
                ,200,
                "void jsonnet_json_object_append(JsonnetVm *, JsonnetJsonValue *, const char *, JsonnetJsonValue *)"
               );
}

Assistant:

void jsonnet_json_object_append(JsonnetVm *vm, JsonnetJsonValue *obj, const char *f,
                                JsonnetJsonValue *v)
{
    (void)vm;
    assert(obj->kind == JsonnetJsonValue::OBJECT);
    obj->fields[std::string(f)] = std::unique_ptr<JsonnetJsonValue>(v);
}